

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::Consume(ParserImpl *this,string *value)

{
  string *__lhs;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __lhs = &(this->tokenizer_).current_.text;
  bVar1 = std::operator!=(__lhs,value);
  if (bVar1) {
    std::operator+(&local_48,"Expected \"",value);
    std::operator+(&bStack_a8,&local_48,"\", found \"");
    std::operator+(&local_88,&bStack_a8,__lhs);
    std::operator+(&local_68,&local_88,"\".");
    ReportError(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&bStack_a8);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    io::Tokenizer::Next(&this->tokenizer_);
  }
  return !bVar1;
}

Assistant:

bool Consume(const string& value) {
    const string& current_value = tokenizer_.current().text;

    if (current_value != value) {
      ReportError("Expected \"" + value + "\", found \"" + current_value
                  + "\".");
      return false;
    }

    tokenizer_.Next();

    return true;
  }